

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O1

void __thiscall xemmai::ast::t_lambda::f_flow(t_lambda *this,t_flow *a_flow)

{
  pointer puVar1;
  t_node *ptVar2;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *p;
  pointer puVar3;
  
  t_scope::f_analyze(&this->super_t_scope,this->v_arguments);
  puVar1 = (this->v_defaults).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->v_defaults).
                super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    ptVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
             _M_t.
             super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
             .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
    (*ptVar2->_vptr_t_node[2])(ptVar2,a_flow);
  }
  return;
}

Assistant:

void t_lambda::f_flow(t_flow& a_flow)
{
	f_analyze(v_arguments);
	for (auto& p : v_defaults) p->f_flow(a_flow);
}